

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# read.cpp
# Opt level: O3

void testReadTiles(string *tempdir)

{
  int iVar1;
  ostream *poVar2;
  size_t sVar3;
  undefined8 extraout_RAX;
  ostream *in_RCX;
  char *pcVar4;
  char *pcVar5;
  char *unaff_R12;
  char *pcVar6;
  ostream *unaff_R15;
  exr_context_t f;
  int levelsy;
  int levelsx;
  int32_t ccount;
  exr_storage_t ps;
  uint64_t pchunksz;
  string fn;
  exr_chunk_info_t cinfo;
  exr_decode_pipeline_t decoder;
  undefined8 local_2f8;
  int local_2f0;
  int local_2ec;
  undefined1 local_2e8 [4];
  int local_2e4;
  long local_2e0;
  long *local_2d8 [2];
  long local_2c8 [2];
  ostream local_2b8 [22];
  char local_2a2;
  char local_2a1;
  long local_298;
  long local_290;
  long local_288;
  long local_280;
  undefined8 local_278;
  code *local_270;
  undefined8 local_268;
  undefined8 uStack_260;
  undefined8 local_258;
  undefined8 uStack_250;
  undefined8 local_248;
  undefined8 uStack_240;
  undefined8 local_238;
  undefined8 uStack_230;
  undefined8 local_228;
  undefined8 uStack_220;
  undefined8 local_218;
  undefined8 *local_210;
  short local_208;
  long local_1b0;
  long local_1a0;
  
  local_2d8[0] = local_2c8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_2d8,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRCoreTest/../OpenEXRTest/"
             ,"");
  local_228 = 0;
  local_238 = 0;
  uStack_230 = 0;
  local_248 = 0;
  uStack_240 = 0;
  local_258 = 0;
  uStack_250 = 0;
  local_268 = 0;
  uStack_260 = 0;
  local_218 = 0;
  local_278 = 0x68;
  uStack_220 = 0xbf800000fffffffe;
  local_270 = err_cb;
  std::__cxx11::string::append((char *)local_2d8);
  iVar1 = exr_start_read(&local_2f8,local_2d8[0],&local_278);
  if (iVar1 == 0) {
    iVar1 = exr_get_storage(local_2f8,0,&local_2e4);
    if (iVar1 != 0) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"Return Error: (",0xf);
      poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,iVar1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,") ",2);
      pcVar6 = (char *)exr_get_default_error_message(iVar1);
      if (pcVar6 != (char *)0x0) goto LAB_00141de7;
      std::ios::clear((int)poVar2 + (int)*(undefined8 *)(*(long *)poVar2 + -0x18));
      goto LAB_00141dfd;
    }
    if (local_2e4 != 1) {
      core_test_fail("EXR_STORAGE_TILED == ps",(char *)0x17c,0x182953,(char *)in_RCX);
      iVar1 = 0;
LAB_00140cb2:
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"Return Error: (",0xf);
      poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,iVar1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,") ",2);
      pcVar6 = (char *)exr_get_default_error_message(iVar1);
      if (pcVar6 != (char *)0x0) goto LAB_00141e3c;
      std::ios::clear((int)poVar2 + (int)*(undefined8 *)(*(long *)poVar2 + -0x18));
      goto LAB_00141e52;
    }
    iVar1 = exr_get_chunk_count(0,0,local_2e8);
    if (iVar1 != 2) goto LAB_00140cb2;
    iVar1 = exr_get_chunk_count(local_2f8,0xffffffff,local_2e8);
    if (iVar1 != 4) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"Return Error: (",0xf);
      poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,iVar1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,") ",2);
      pcVar6 = (char *)exr_get_default_error_message(iVar1);
      if (pcVar6 == (char *)0x0) {
        std::ios::clear((int)poVar2 + (int)*(undefined8 *)(*(long *)poVar2 + -0x18));
      }
      else {
        sVar3 = strlen(pcVar6);
        std::__ostream_insert<char,std::char_traits<char>>(poVar2,pcVar6,sVar3);
      }
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n    expected: (",0x10);
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,4);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,") ",2);
      pcVar6 = (char *)exr_get_default_error_message(4);
      if ((float *)pcVar6 != (float *)0x0) goto LAB_00142de1;
      std::ios::clear((int)poVar2 + (int)*(undefined8 *)(*(long *)poVar2 + -0x18));
      goto LAB_00142df7;
    }
    iVar1 = exr_get_chunk_count(local_2f8,0xb,local_2e8);
    if (iVar1 != 4) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"Return Error: (",0xf);
      poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,iVar1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,") ",2);
      pcVar6 = (char *)exr_get_default_error_message(iVar1);
      if (pcVar6 == (char *)0x0) {
        std::ios::clear((int)poVar2 + (int)*(undefined8 *)(*(long *)poVar2 + -0x18));
      }
      else {
        sVar3 = strlen(pcVar6);
        std::__ostream_insert<char,std::char_traits<char>>(poVar2,pcVar6,sVar3);
      }
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n    expected: (",0x10);
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,4);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,") ",2);
      pcVar6 = (char *)exr_get_default_error_message(4);
      if ((float *)pcVar6 != (float *)0x0) goto LAB_00142e36;
      std::ios::clear((int)poVar2 + (int)*(undefined8 *)(*(long *)poVar2 + -0x18));
      goto LAB_00142e4c;
    }
    iVar1 = exr_get_chunk_count(local_2f8,0,0);
    if (iVar1 != 3) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"Return Error: (",0xf);
      poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,iVar1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,") ",2);
      pcVar6 = (char *)exr_get_default_error_message(iVar1);
      if (pcVar6 == (char *)0x0) {
        std::ios::clear((int)poVar2 + (int)*(undefined8 *)(*(long *)poVar2 + -0x18));
      }
      else {
        sVar3 = strlen(pcVar6);
        std::__ostream_insert<char,std::char_traits<char>>(poVar2,pcVar6,sVar3);
      }
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n    expected: (",0x10);
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,3);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,") ",2);
      pcVar6 = (char *)exr_get_default_error_message(3);
      if ((float *)pcVar6 != (float *)0x0) goto LAB_00142e8b;
      std::ios::clear((int)poVar2 + (int)*(undefined8 *)(*(long *)poVar2 + -0x18));
      goto LAB_00142ea1;
    }
    iVar1 = exr_get_chunk_count(local_2f8,0,local_2e8);
    if (iVar1 != 0) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"Return Error: (",0xf);
      poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,iVar1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,") ",2);
      pcVar6 = (char *)exr_get_default_error_message(iVar1);
      if (pcVar6 == (char *)0x0) {
        std::ios::clear((int)poVar2 + (int)*(undefined8 *)(*(long *)poVar2 + -0x18));
      }
      else {
        sVar3 = strlen(pcVar6);
        std::__ostream_insert<char,std::char_traits<char>>(poVar2,pcVar6,sVar3);
      }
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
      std::ostream::put((char)poVar2);
      std::ostream::flush();
      core_test_fail("exr_get_chunk_count (f, 0, &ccount)",(char *)0x187,0x182953,(char *)in_RCX);
LAB_00142099:
      sVar3 = strlen(pcVar6);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,pcVar6,sVar3);
LAB_001420af:
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n    expected: (",0x10);
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x12);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,") ",2);
      pcVar6 = (char *)exr_get_default_error_message(0x12);
      if ((float *)pcVar6 != (float *)0x0) goto LAB_00142ee0;
      std::ios::clear((int)poVar2 + (int)*(undefined8 *)(*(long *)poVar2 + -0x18));
      goto LAB_00142ef6;
    }
    iVar1 = exr_get_scanlines_per_chunk(local_2f8,0,local_2e8);
    if (iVar1 != 0x12) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"Return Error: (",0xf);
      poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,iVar1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,") ",2);
      pcVar6 = (char *)exr_get_default_error_message(iVar1);
      if (pcVar6 != (char *)0x0) goto LAB_00142099;
      std::ios::clear((int)poVar2 + (int)*(undefined8 *)(*(long *)poVar2 + -0x18));
      goto LAB_001420af;
    }
    local_2ec = -1;
    in_RCX = (ostream *)&local_2f0;
    local_2f0 = -1;
    iVar1 = exr_get_tile_levels(0,0);
    if (iVar1 != 2) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"Return Error: (",0xf);
      poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,iVar1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,") ",2);
      pcVar6 = (char *)exr_get_default_error_message(iVar1);
      if (pcVar6 == (char *)0x0) {
        std::ios::clear((int)poVar2 + (int)*(undefined8 *)(*(long *)poVar2 + -0x18));
      }
      else {
        sVar3 = strlen(pcVar6);
        std::__ostream_insert<char,std::char_traits<char>>(poVar2,pcVar6,sVar3);
      }
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n    expected: (",0x10);
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,2);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,") ",2);
      pcVar6 = (char *)exr_get_default_error_message(2);
      if ((float *)pcVar6 != (float *)0x0) goto LAB_00142f35;
      std::ios::clear((int)poVar2 + (int)*(undefined8 *)(*(long *)poVar2 + -0x18));
      goto LAB_00142f4b;
    }
    iVar1 = 2;
    if (local_2ec != -1) {
      pcVar4 = (char *)0x190;
      pcVar6 = "levelsx == -1";
LAB_001415bd:
      core_test_fail(pcVar6,pcVar4,0x182953,(char *)in_RCX);
LAB_001415cc:
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"Return Error: (",0xf);
      poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,iVar1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,") ",2);
      pcVar6 = (char *)exr_get_default_error_message(iVar1);
      if (pcVar6 == (char *)0x0) {
        std::ios::clear((int)poVar2 + (int)*(undefined8 *)(*(long *)poVar2 + -0x18));
      }
      else {
LAB_001426fc:
        sVar3 = strlen(pcVar6);
        std::__ostream_insert<char,std::char_traits<char>>(poVar2,pcVar6,sVar3);
      }
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n    expected: (",0x10);
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x12);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,") ",2);
      pcVar6 = (char *)exr_get_default_error_message(0x12);
      if ((float *)pcVar6 != (float *)0x0) goto LAB_00143188;
      std::ios::clear((int)poVar2 + (int)*(undefined8 *)(*(long *)poVar2 + -0x18));
      goto LAB_0014319e;
    }
    pcVar6 = "levelsy == -1";
    if (local_2f0 != -1) {
      pcVar4 = (char *)0x191;
      goto LAB_001415bd;
    }
    in_RCX = (ostream *)&local_2f0;
    iVar1 = exr_get_tile_levels(local_2f8,1,&local_2ec);
    if (iVar1 != 4) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"Return Error: (",0xf);
      poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,iVar1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,") ",2);
      pcVar6 = (char *)exr_get_default_error_message(iVar1);
      if (pcVar6 == (char *)0x0) {
        std::ios::clear((int)poVar2 + (int)*(undefined8 *)(*(long *)poVar2 + -0x18));
      }
      else {
        sVar3 = strlen(pcVar6);
        std::__ostream_insert<char,std::char_traits<char>>(poVar2,pcVar6,sVar3);
      }
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n    expected: (",0x10);
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,4);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,") ",2);
      pcVar6 = (char *)exr_get_default_error_message(4);
      if ((float *)pcVar6 != (float *)0x0) goto LAB_00142f8a;
      std::ios::clear((int)poVar2 + (int)*(undefined8 *)(*(long *)poVar2 + -0x18));
      goto LAB_00142fa0;
    }
    iVar1 = 4;
    if (local_2ec != -1) {
      pcVar4 = (char *)0x196;
      pcVar6 = "levelsx == -1";
      goto LAB_001415bd;
    }
    if (local_2f0 != -1) {
      pcVar4 = (char *)0x197;
      goto LAB_001415bd;
    }
    in_RCX = (ostream *)0x0;
    iVar1 = exr_get_tile_levels(local_2f8,0,0);
    if (iVar1 != 0) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"Return Error: (",0xf);
      poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,iVar1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,") ",2);
      pcVar6 = (char *)exr_get_default_error_message(iVar1);
      if (pcVar6 == (char *)0x0) {
        std::ios::clear((int)poVar2 + (int)*(undefined8 *)(*(long *)poVar2 + -0x18));
      }
      else {
        sVar3 = strlen(pcVar6);
        std::__ostream_insert<char,std::char_traits<char>>(poVar2,pcVar6,sVar3);
      }
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
      std::ostream::put((char)poVar2);
      std::ostream::flush();
      core_test_fail("exr_get_tile_levels (f, 0, __null, __null)",(char *)0x199,0x182953,
                     (char *)in_RCX);
LAB_00142274:
      sVar3 = strlen(pcVar6);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,pcVar6,sVar3);
LAB_0014228a:
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
      std::ostream::put((char)poVar2);
      std::ostream::flush();
      core_test_fail("exr_get_tile_levels (f, 0, &levelsx, __null)",(char *)0x19c,0x182953,
                     (char *)in_RCX);
LAB_001422c9:
      sVar3 = strlen(pcVar6);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,pcVar6,sVar3);
LAB_001422df:
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
      std::ostream::put((char)poVar2);
      std::ostream::flush();
      core_test_fail("exr_get_tile_levels (f, 0, __null, &levelsy)",(char *)0x1a0,0x182953,
                     (char *)in_RCX);
LAB_0014231e:
      sVar3 = strlen(pcVar6);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,pcVar6,sVar3);
LAB_00142334:
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
      std::ostream::put((char)poVar2);
      std::ostream::flush();
      core_test_fail("exr_get_tile_levels (f, 0, &levelsx, &levelsy)",(char *)0x1a4,0x182953,
                     (char *)in_RCX);
LAB_00142373:
      sVar3 = strlen(pcVar6);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,pcVar6,sVar3);
LAB_00142389:
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n    expected: (",0x10);
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,2);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,") ",2);
      pcVar6 = (char *)exr_get_default_error_message(2);
      if ((float *)pcVar6 != (float *)0x0) goto LAB_00142fdf;
      std::ios::clear((int)poVar2 + (int)*(undefined8 *)(*(long *)poVar2 + -0x18));
      goto LAB_00142ff5;
    }
    local_2ec = -1;
    in_RCX = (ostream *)0x0;
    iVar1 = exr_get_tile_levels(local_2f8,0);
    if (iVar1 != 0) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"Return Error: (",0xf);
      poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,iVar1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,") ",2);
      pcVar6 = (char *)exr_get_default_error_message(iVar1);
      if (pcVar6 != (char *)0x0) goto LAB_00142274;
      std::ios::clear((int)poVar2 + (int)*(undefined8 *)(*(long *)poVar2 + -0x18));
      goto LAB_0014228a;
    }
    if (local_2ec != 1) {
      pcVar4 = (char *)0x19d;
      iVar1 = 0;
      pcVar6 = "levelsx == 1";
      goto LAB_001415bd;
    }
    in_RCX = (ostream *)&local_2f0;
    local_2f0 = -1;
    iVar1 = exr_get_tile_levels(local_2f8,0,0);
    if (iVar1 != 0) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"Return Error: (",0xf);
      poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,iVar1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,") ",2);
      pcVar6 = (char *)exr_get_default_error_message(iVar1);
      if (pcVar6 != (char *)0x0) goto LAB_001422c9;
      std::ios::clear((int)poVar2 + (int)*(undefined8 *)(*(long *)poVar2 + -0x18));
      goto LAB_001422df;
    }
    pcVar6 = "levelsy == 1";
    if (local_2f0 != 1) {
      pcVar4 = (char *)0x1a1;
      iVar1 = 0;
      goto LAB_001415bd;
    }
    in_RCX = (ostream *)&local_2f0;
    local_2f0 = -1;
    local_2ec = -1;
    iVar1 = exr_get_tile_levels(local_2f8,0);
    if (iVar1 != 0) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"Return Error: (",0xf);
      poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,iVar1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,") ",2);
      pcVar6 = (char *)exr_get_default_error_message(iVar1);
      if (pcVar6 != (char *)0x0) goto LAB_0014231e;
      std::ios::clear((int)poVar2 + (int)*(undefined8 *)(*(long *)poVar2 + -0x18));
      goto LAB_00142334;
    }
    iVar1 = 0;
    if (local_2ec != 1) {
      pcVar4 = (char *)0x1a5;
      pcVar6 = "levelsx == 1";
      goto LAB_001415bd;
    }
    if (local_2f0 != 1) {
      pcVar4 = (char *)0x1a6;
      goto LAB_001415bd;
    }
    in_RCX = (ostream *)0x0;
    iVar1 = exr_get_tile_sizes(0,0,0,0,0,0);
    if (iVar1 != 2) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"Return Error: (",0xf);
      poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,iVar1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,") ",2);
      pcVar6 = (char *)exr_get_default_error_message(iVar1);
      if (pcVar6 != (char *)0x0) goto LAB_00142373;
      std::ios::clear((int)poVar2 + (int)*(undefined8 *)(*(long *)poVar2 + -0x18));
      goto LAB_00142389;
    }
    in_RCX = (ostream *)0x0;
    iVar1 = exr_get_tile_sizes(local_2f8,0,0xffffffff,0,&local_2ec,&local_2f0);
    if (iVar1 != 4) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"Return Error: (",0xf);
      poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,iVar1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,") ",2);
      pcVar6 = (char *)exr_get_default_error_message(iVar1);
      if (pcVar6 == (char *)0x0) {
        std::ios::clear((int)poVar2 + (int)*(undefined8 *)(*(long *)poVar2 + -0x18));
      }
      else {
        sVar3 = strlen(pcVar6);
        std::__ostream_insert<char,std::char_traits<char>>(poVar2,pcVar6,sVar3);
      }
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n    expected: (",0x10);
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,4);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,") ",2);
      pcVar6 = (char *)exr_get_default_error_message(4);
      if ((float *)pcVar6 != (float *)0x0) goto LAB_00143034;
      std::ios::clear((int)poVar2 + (int)*(undefined8 *)(*(long *)poVar2 + -0x18));
      goto LAB_0014304a;
    }
    in_RCX = (ostream *)0xffffffff;
    iVar1 = exr_get_tile_sizes(local_2f8,0,0,0xffffffff,&local_2ec,&local_2f0);
    if (iVar1 != 4) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"Return Error: (",0xf);
      poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,iVar1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,") ",2);
      pcVar6 = (char *)exr_get_default_error_message(iVar1);
      if (pcVar6 == (char *)0x0) {
        std::ios::clear((int)poVar2 + (int)*(undefined8 *)(*(long *)poVar2 + -0x18));
      }
      else {
        sVar3 = strlen(pcVar6);
        std::__ostream_insert<char,std::char_traits<char>>(poVar2,pcVar6,sVar3);
      }
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n    expected: (",0x10);
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,4);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,") ",2);
      pcVar6 = (char *)exr_get_default_error_message(4);
      if ((float *)pcVar6 != (float *)0x0) goto LAB_00143089;
      std::ios::clear((int)poVar2 + (int)*(undefined8 *)(*(long *)poVar2 + -0x18));
      goto LAB_0014309f;
    }
    in_RCX = (ostream *)0x64;
    iVar1 = exr_get_tile_sizes(local_2f8,0,0,100,&local_2ec,&local_2f0);
    if (iVar1 != 4) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"Return Error: (",0xf);
      poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,iVar1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,") ",2);
      pcVar6 = (char *)exr_get_default_error_message(iVar1);
      if (pcVar6 == (char *)0x0) {
        std::ios::clear((int)poVar2 + (int)*(undefined8 *)(*(long *)poVar2 + -0x18));
      }
      else {
        sVar3 = strlen(pcVar6);
        std::__ostream_insert<char,std::char_traits<char>>(poVar2,pcVar6,sVar3);
      }
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n    expected: (",0x10);
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,4);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,") ",2);
      pcVar6 = (char *)exr_get_default_error_message(4);
      if ((float *)pcVar6 != (float *)0x0) goto LAB_001430de;
      std::ios::clear((int)poVar2 + (int)*(undefined8 *)(*(long *)poVar2 + -0x18));
      goto LAB_001430f4;
    }
    in_RCX = (ostream *)0x0;
    iVar1 = exr_get_tile_sizes(local_2f8,0,100,0,&local_2ec,&local_2f0);
    if (iVar1 != 4) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"Return Error: (",0xf);
      poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,iVar1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,") ",2);
      pcVar6 = (char *)exr_get_default_error_message(iVar1);
      if (pcVar6 == (char *)0x0) {
        std::ios::clear((int)poVar2 + (int)*(undefined8 *)(*(long *)poVar2 + -0x18));
      }
      else {
        sVar3 = strlen(pcVar6);
        std::__ostream_insert<char,std::char_traits<char>>(poVar2,pcVar6,sVar3);
      }
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n    expected: (",0x10);
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,4);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,") ",2);
      pcVar6 = (char *)exr_get_default_error_message(4);
      if ((float *)pcVar6 != (float *)0x0) goto LAB_00143133;
      std::ios::clear((int)poVar2 + (int)*(undefined8 *)(*(long *)poVar2 + -0x18));
      goto LAB_00143149;
    }
    in_RCX = (ostream *)0x0;
    iVar1 = exr_get_tile_sizes(local_2f8,0,0,0,&local_2ec,&local_2f0);
    if (iVar1 != 0) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"Return Error: (",0xf);
      poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,iVar1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,") ",2);
      pcVar6 = (char *)exr_get_default_error_message(iVar1);
      if (pcVar6 == (char *)0x0) {
        std::ios::clear((int)poVar2 + (int)*(undefined8 *)(*(long *)poVar2 + -0x18));
      }
      else {
        sVar3 = strlen(pcVar6);
        std::__ostream_insert<char,std::char_traits<char>>(poVar2,pcVar6,sVar3);
      }
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
      std::ostream::put((char)poVar2);
      std::ostream::flush();
      core_test_fail("exr_get_tile_sizes (f, 0, 0, 0, &levelsx, &levelsy)",(char *)0x1b7,0x182953,
                     (char *)in_RCX);
LAB_00142652:
      sVar3 = strlen(pcVar6);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,pcVar6,sVar3);
LAB_00142668:
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
      std::ostream::put((char)poVar2);
      std::ostream::flush();
      core_test_fail("exr_get_tile_sizes (f, 0, 0, 0, &levelsx, __null)",(char *)0x1bb,0x182953,
                     (char *)in_RCX);
LAB_001426a7:
      sVar3 = strlen(pcVar6);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,pcVar6,sVar3);
LAB_001426bd:
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
      std::ostream::put((char)poVar2);
      std::ostream::flush();
      core_test_fail("exr_get_tile_sizes (f, 0, 0, 0, __null, &levelsy)",(char *)0x1be,0x182953,
                     (char *)in_RCX);
      goto LAB_001426fc;
    }
    iVar1 = 0;
    if (local_2ec != 0xc) {
      pcVar4 = (char *)0x1b8;
      pcVar6 = "levelsx == 12";
      goto LAB_001415bd;
    }
    pcVar6 = "levelsy == 24";
    if (local_2f0 != 0x18) {
      pcVar4 = (char *)0x1b9;
      goto LAB_001415bd;
    }
    local_2ec = -1;
    in_RCX = (ostream *)0x0;
    iVar1 = exr_get_tile_sizes(local_2f8,0,0,0,&local_2ec,0);
    if (iVar1 != 0) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"Return Error: (",0xf);
      poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,iVar1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,") ",2);
      pcVar6 = (char *)exr_get_default_error_message(iVar1);
      if (pcVar6 != (char *)0x0) goto LAB_00142652;
      std::ios::clear((int)poVar2 + (int)*(undefined8 *)(*(long *)poVar2 + -0x18));
      goto LAB_00142668;
    }
    if (local_2ec != 0xc) {
      pcVar4 = (char *)0x1bc;
      iVar1 = 0;
      pcVar6 = "levelsx == 12";
      goto LAB_001415bd;
    }
    local_2f0 = -1;
    in_RCX = (ostream *)0x0;
    iVar1 = exr_get_tile_sizes(local_2f8,0,0,0,0);
    if (iVar1 != 0) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"Return Error: (",0xf);
      poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,iVar1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,") ",2);
      pcVar6 = (char *)exr_get_default_error_message(iVar1);
      if (pcVar6 != (char *)0x0) goto LAB_001426a7;
      std::ios::clear((int)poVar2 + (int)*(undefined8 *)(*(long *)poVar2 + -0x18));
      goto LAB_001426bd;
    }
    if (local_2f0 != 0x18) {
      pcVar4 = (char *)0x1bf;
      iVar1 = 0;
      goto LAB_001415bd;
    }
    poVar2 = local_2b8;
    in_RCX = poVar2;
    iVar1 = exr_read_scanline_chunk_info(local_2f8,0,0x2a);
    if (iVar1 != 0x12) goto LAB_001415cc;
    in_RCX = (ostream *)0x2;
    iVar1 = exr_read_tile_chunk_info(0,0,4,2,0,0,poVar2);
    if (iVar1 != 2) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"Return Error: (",0xf);
      poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,iVar1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,") ",2);
      pcVar6 = (char *)exr_get_default_error_message(iVar1);
      if (pcVar6 == (char *)0x0) {
        std::ios::clear((int)poVar2 + (int)*(undefined8 *)(*(long *)poVar2 + -0x18));
      }
      else {
        sVar3 = strlen(pcVar6);
        std::__ostream_insert<char,std::char_traits<char>>(poVar2,pcVar6,sVar3);
      }
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n    expected: (",0x10);
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,2);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,") ",2);
      pcVar6 = (char *)exr_get_default_error_message(2);
      if ((float *)pcVar6 != (float *)0x0) goto LAB_001431dd;
      std::ios::clear((int)poVar2 + (int)*(undefined8 *)(*(long *)poVar2 + -0x18));
      goto LAB_001431f3;
    }
    in_RCX = (ostream *)0x2;
    iVar1 = exr_read_tile_chunk_info(local_2f8,0xffffffff,4,2,0,0,poVar2);
    if (iVar1 != 4) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"Return Error: (",0xf);
      poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,iVar1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,") ",2);
      pcVar6 = (char *)exr_get_default_error_message(iVar1);
      if (pcVar6 == (char *)0x0) {
        std::ios::clear((int)poVar2 + (int)*(undefined8 *)(*(long *)poVar2 + -0x18));
      }
      else {
        sVar3 = strlen(pcVar6);
        std::__ostream_insert<char,std::char_traits<char>>(poVar2,pcVar6,sVar3);
      }
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n    expected: (",0x10);
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,4);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,") ",2);
      pcVar6 = (char *)exr_get_default_error_message(4);
      if ((float *)pcVar6 != (float *)0x0) goto LAB_00143232;
      std::ios::clear((int)poVar2 + (int)*(undefined8 *)(*(long *)poVar2 + -0x18));
      goto LAB_00143248;
    }
    in_RCX = (ostream *)0x2;
    iVar1 = exr_read_tile_chunk_info(local_2f8,1,4,2,0,0,poVar2);
    if (iVar1 != 4) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"Return Error: (",0xf);
      poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,iVar1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,") ",2);
      pcVar6 = (char *)exr_get_default_error_message(iVar1);
      if (pcVar6 == (char *)0x0) {
        std::ios::clear((int)poVar2 + (int)*(undefined8 *)(*(long *)poVar2 + -0x18));
      }
      else {
        sVar3 = strlen(pcVar6);
        std::__ostream_insert<char,std::char_traits<char>>(poVar2,pcVar6,sVar3);
      }
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n    expected: (",0x10);
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,4);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,") ",2);
      pcVar6 = (char *)exr_get_default_error_message(4);
      if ((float *)pcVar6 != (float *)0x0) goto LAB_00143287;
      std::ios::clear((int)poVar2 + (int)*(undefined8 *)(*(long *)poVar2 + -0x18));
      goto LAB_0014329d;
    }
    in_RCX = (ostream *)0x2;
    iVar1 = exr_read_tile_chunk_info(local_2f8,0,4,2,0,0,0);
    if (iVar1 != 3) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"Return Error: (",0xf);
      poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,iVar1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,") ",2);
      pcVar6 = (char *)exr_get_default_error_message(iVar1);
      if (pcVar6 == (char *)0x0) {
        std::ios::clear((int)poVar2 + (int)*(undefined8 *)(*(long *)poVar2 + -0x18));
      }
      else {
        sVar3 = strlen(pcVar6);
        std::__ostream_insert<char,std::char_traits<char>>(poVar2,pcVar6,sVar3);
      }
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n    expected: (",0x10);
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,3);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,") ",2);
      pcVar6 = (char *)exr_get_default_error_message(3);
      if ((float *)pcVar6 != (float *)0x0) goto LAB_001432dc;
      std::ios::clear((int)poVar2 + (int)*(undefined8 *)(*(long *)poVar2 + -0x18));
      goto LAB_001432f2;
    }
    in_RCX = (ostream *)0x2;
    iVar1 = exr_read_tile_chunk_info(local_2f8,0,4,2,0,0xffffffff,poVar2);
    if (iVar1 != 3) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"Return Error: (",0xf);
      poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,iVar1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,") ",2);
      pcVar6 = (char *)exr_get_default_error_message(iVar1);
      if (pcVar6 == (char *)0x0) {
        std::ios::clear((int)poVar2 + (int)*(undefined8 *)(*(long *)poVar2 + -0x18));
      }
      else {
        sVar3 = strlen(pcVar6);
        std::__ostream_insert<char,std::char_traits<char>>(poVar2,pcVar6,sVar3);
      }
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n    expected: (",0x10);
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,3);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,") ",2);
      pcVar6 = (char *)exr_get_default_error_message(3);
      if ((float *)pcVar6 != (float *)0x0) goto LAB_00143331;
      std::ios::clear((int)poVar2 + (int)*(undefined8 *)(*(long *)poVar2 + -0x18));
      goto LAB_00143347;
    }
    in_RCX = (ostream *)0x2;
    iVar1 = exr_read_tile_chunk_info(local_2f8,0,4,2,0xffffffff,0,poVar2);
    if (iVar1 != 3) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"Return Error: (",0xf);
      poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,iVar1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,") ",2);
      pcVar6 = (char *)exr_get_default_error_message(iVar1);
      if (pcVar6 == (char *)0x0) {
        std::ios::clear((int)poVar2 + (int)*(undefined8 *)(*(long *)poVar2 + -0x18));
      }
      else {
        sVar3 = strlen(pcVar6);
        std::__ostream_insert<char,std::char_traits<char>>(poVar2,pcVar6,sVar3);
      }
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n    expected: (",0x10);
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,3);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,") ",2);
      pcVar6 = (char *)exr_get_default_error_message(3);
      if ((float *)pcVar6 != (float *)0x0) goto LAB_00143386;
      std::ios::clear((int)poVar2 + (int)*(undefined8 *)(*(long *)poVar2 + -0x18));
      goto LAB_0014339c;
    }
    in_RCX = (ostream *)0xfffffffe;
    iVar1 = exr_read_tile_chunk_info(local_2f8,0,4,0xfffffffe,0,0,poVar2);
    if (iVar1 != 3) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"Return Error: (",0xf);
      poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,iVar1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,") ",2);
      pcVar6 = (char *)exr_get_default_error_message(iVar1);
      if (pcVar6 == (char *)0x0) {
        std::ios::clear((int)poVar2 + (int)*(undefined8 *)(*(long *)poVar2 + -0x18));
      }
      else {
        sVar3 = strlen(pcVar6);
        std::__ostream_insert<char,std::char_traits<char>>(poVar2,pcVar6,sVar3);
      }
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n    expected: (",0x10);
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,3);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,") ",2);
      pcVar6 = (char *)exr_get_default_error_message(3);
      if ((float *)pcVar6 != (float *)0x0) goto LAB_001433db;
      std::ios::clear((int)poVar2 + (int)*(undefined8 *)(*(long *)poVar2 + -0x18));
      goto LAB_001433f1;
    }
    in_RCX = (ostream *)0x2;
    iVar1 = exr_read_tile_chunk_info(local_2f8,0,0xfffffffc,2,0,0,poVar2);
    if (iVar1 == 3) {
      in_RCX = (ostream *)0x2;
      iVar1 = exr_read_tile_chunk_info(local_2f8,0,4,2,0,0,poVar2);
      if (iVar1 == 0) {
        local_2e0 = 0;
        iVar1 = exr_get_chunk_unpacked_size(local_2f8,0);
        if (iVar1 != 0) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cerr,"Return Error: (",0xf);
          poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,iVar1);
          std::__ostream_insert<char,std::char_traits<char>>(poVar2,") ",2);
          pcVar6 = (char *)exr_get_default_error_message(iVar1);
          if ((float *)pcVar6 != (float *)0x0) goto LAB_00142be3;
          std::ios::clear((int)poVar2 + (int)*(undefined8 *)(*(long *)poVar2 + -0x18));
          goto LAB_00142bf9;
        }
        if (local_2a2 != '\x01') {
          pcVar6 = (char *)0x1e3;
          pcVar4 = "cinfo.type == EXR_STORAGE_TILED";
LAB_00141ad8:
          core_test_fail(pcVar4,pcVar6,0x182953,(char *)in_RCX);
          iVar1 = 0;
LAB_00141ae4:
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cerr,"Return Error: (",0xf);
          poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,iVar1);
          std::__ostream_insert<char,std::char_traits<char>>(poVar2,") ",2);
          pcVar6 = (char *)exr_get_default_error_message(iVar1);
          if ((float *)pcVar6 != (float *)0x0) goto LAB_00142c38;
          std::ios::clear((int)poVar2 + (int)*(undefined8 *)(*(long *)poVar2 + -0x18));
          goto LAB_00142c4e;
        }
        if (local_2a1 != '\0') {
          pcVar6 = (char *)0x1e4;
          pcVar4 = "cinfo.compression == EXR_COMPRESSION_NONE";
          goto LAB_00141ad8;
        }
        if (local_298 != local_2e0) {
          pcVar6 = (char *)0x1e5;
          pcVar4 = "cinfo.packed_size == pchunksz";
          goto LAB_00141ad8;
        }
        if (local_290 != local_298) {
          pcVar6 = (char *)0x1e6;
          pcVar4 = "cinfo.unpacked_size == pchunksz";
          goto LAB_00141ad8;
        }
        if (local_288 != 0) {
          pcVar6 = (char *)0x1e7;
          pcVar4 = "cinfo.sample_count_data_offset == 0";
          goto LAB_00141ad8;
        }
        if (local_280 != 0) {
          pcVar6 = (char *)0x1e8;
          pcVar4 = "cinfo.sample_count_table_size == 0";
          goto LAB_00141ad8;
        }
        in_RCX = (ostream *)&local_210;
        iVar1 = exr_decoding_initialize(local_2f8,0,local_2b8);
        if (iVar1 != 0) goto LAB_00141ae4;
        if (local_208 != 2) {
          pcVar4 = (char *)0x1ed;
          pcVar5 = "decoder.channel_count == 2";
LAB_00141bed:
          core_test_fail(pcVar5,pcVar4,0x182953,(char *)in_RCX);
          iVar1 = 0;
LAB_00141bf9:
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cerr,"Return Error: (",0xf);
          unaff_R15 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,iVar1);
          std::__ostream_insert<char,std::char_traits<char>>(unaff_R15,") ",2);
          unaff_R12 = (char *)exr_get_default_error_message(iVar1);
          if (unaff_R12 != (char *)0x0) goto LAB_00142c8d;
          std::ios::clear((int)unaff_R15 + (int)*(undefined8 *)(*(long *)unaff_R15 + -0x18));
          goto LAB_00142ca3;
        }
        pcVar4 = (char *)0x1ee;
        pcVar5 = "!strcmp (decoder.channels[0].channel_name, \"G\")";
        if ((*(char *)*local_210 != 'G') || (((char *)*local_210)[1] != '\0')) goto LAB_00141bed;
        if (*(char *)((long)local_210 + 0x19) != '\x02') {
          pcVar4 = (char *)0x1ef;
          pcVar5 = "decoder.channels[0].bytes_per_element == 2";
          goto LAB_00141bed;
        }
        if (*(int *)((long)local_210 + 0xc) != 0xc) {
          pcVar4 = (char *)0x1f0;
          pcVar5 = "decoder.channels[0].width == 12";
          goto LAB_00141bed;
        }
        if (*(int *)(local_210 + 1) != 0x18) {
          pcVar4 = (char *)0x1f1;
          pcVar5 = "decoder.channels[0].height == 24";
          goto LAB_00141bed;
        }
        if (*(int *)(local_210 + 2) != 1) {
          pcVar4 = (char *)0x1f2;
          pcVar5 = "decoder.channels[0].x_samples == 1";
          goto LAB_00141bed;
        }
        if (*(int *)((long)local_210 + 0x14) != 1) {
          pcVar4 = (char *)0x1f3;
          pcVar5 = "decoder.channels[0].y_samples == 1";
          goto LAB_00141bed;
        }
        pcVar4 = (char *)0x1f4;
        pcVar5 = "!strcmp (decoder.channels[1].channel_name, \"Z\")";
        if ((*(char *)local_210[6] != 'Z') || (((char *)local_210[6])[1] != '\0'))
        goto LAB_00141bed;
        if (*(char *)((long)local_210 + 0x49) != '\x04') {
          pcVar4 = (char *)0x1f5;
          pcVar5 = "decoder.channels[1].bytes_per_element == 4";
          goto LAB_00141bed;
        }
        if (*(int *)((long)local_210 + 0x3c) != 0xc) {
          pcVar4 = (char *)0x1f6;
          pcVar5 = "decoder.channels[1].width == 12";
          goto LAB_00141bed;
        }
        if (*(int *)(local_210 + 7) != 0x18) {
          pcVar4 = (char *)0x1f7;
          pcVar5 = "decoder.channels[1].height == 24";
          goto LAB_00141bed;
        }
        if (*(int *)(local_210 + 8) != 1) {
          pcVar4 = (char *)0x1f8;
          pcVar5 = "decoder.channels[1].x_samples == 1";
          goto LAB_00141bed;
        }
        if (*(int *)((long)local_210 + 0x44) != 1) {
          pcVar4 = (char *)0x1f9;
          pcVar5 = "decoder.channels[1].y_samples == 1";
          goto LAB_00141bed;
        }
        poVar2 = (ostream *)operator_new__(0x240);
        pcVar6 = (char *)operator_new__(0x480);
        memset(poVar2,0,0x240);
        memset(pcVar6,0,0x480);
        local_210[5] = poVar2;
        local_210[4] = 0x1800000002;
        *(undefined2 *)((long)local_210 + 0x1c) = 2;
        local_210[0xb] = pcVar6;
        local_210[10] = 0x3000000004;
        *(undefined2 *)((long)local_210 + 0x4c) = 4;
        iVar1 = exr_decoding_choose_default_routines(local_2f8,0,&local_210);
        if (iVar1 != 0) goto LAB_00141bf9;
        iVar1 = exr_decoding_run(local_2f8,0,&local_210);
        if (iVar1 != 0) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cerr,"Return Error: (",0xf);
          unaff_R15 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,iVar1);
          std::__ostream_insert<char,std::char_traits<char>>(unaff_R15,") ",2);
          unaff_R12 = (char *)exr_get_default_error_message(iVar1);
          if (unaff_R12 != (char *)0x0) goto LAB_00142ce2;
          std::ios::clear((int)unaff_R15 + (int)*(undefined8 *)(*(long *)unaff_R15 + -0x18));
          goto LAB_00142cf8;
        }
        if (local_1b0 == 0) {
          if (local_1a0 != 0) {
            pcVar4 = (char *)0x20f;
            pcVar5 = "decoder.unpacked_buffer == __null";
            goto LAB_00141cf1;
          }
          if (*(short *)poVar2 != 0x33d5) goto LAB_00141cfd;
          if (1e-06 <= ABS(*(float *)pcVar6 + -0.244778)) {
            pcVar4 = (char *)0x214;
            pcVar5 = "fabsf (*curz - 0.244778f) < 0.000001f";
            goto LAB_00141d17;
          }
          iVar1 = exr_decoding_destroy(local_2f8,&local_210);
          if (iVar1 == 0) {
            exr_finish(&local_2f8);
            operator_delete__(pcVar6);
            operator_delete__(poVar2);
            if (local_2d8[0] != local_2c8) {
              operator_delete(local_2d8[0],local_2c8[0] + 1);
            }
            return;
          }
        }
        else {
          pcVar4 = (char *)0x20d;
          pcVar5 = "decoder.packed_buffer == __null";
LAB_00141cf1:
          core_test_fail(pcVar5,pcVar4,0x182953,(char *)in_RCX);
LAB_00141cfd:
          pcVar4 = (char *)0x213;
          pcVar5 = "*curg == 0x33d5";
LAB_00141d17:
          core_test_fail(pcVar5,pcVar4,0x182953,(char *)in_RCX);
          iVar1 = 0;
        }
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,"Return Error: (",0xf);
        unaff_R15 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,iVar1);
        std::__ostream_insert<char,std::char_traits<char>>(unaff_R15,") ",2);
        unaff_R12 = (char *)exr_get_default_error_message(iVar1);
        if (unaff_R12 != (char *)0x0) goto LAB_00142d37;
        std::ios::clear((int)unaff_R15 + (int)*(undefined8 *)(*(long *)unaff_R15 + -0x18));
      }
      else {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,"Return Error: (",0xf);
        poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,iVar1);
        std::__ostream_insert<char,std::char_traits<char>>(poVar2,") ",2);
        pcVar6 = (char *)exr_get_default_error_message(iVar1);
        if ((float *)pcVar6 == (float *)0x0) {
          std::ios::clear((int)poVar2 + (int)*(undefined8 *)(*(long *)poVar2 + -0x18));
        }
        else {
          sVar3 = strlen(pcVar6);
          std::__ostream_insert<char,std::char_traits<char>>(poVar2,pcVar6,sVar3);
        }
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
        std::ostream::put((char)poVar2);
        std::ostream::flush();
        core_test_fail("exr_read_tile_chunk_info (f, 0, 4, 2, 0, 0, &cinfo)",(char *)0x1e0,0x182953,
                       (char *)in_RCX);
LAB_00142be3:
        sVar3 = strlen(pcVar6);
        std::__ostream_insert<char,std::char_traits<char>>(poVar2,pcVar6,sVar3);
LAB_00142bf9:
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
        std::ostream::put((char)poVar2);
        std::ostream::flush();
        core_test_fail("exr_get_chunk_unpacked_size (f, 0, &pchunksz)",(char *)0x1e2,0x182953,
                       (char *)in_RCX);
LAB_00142c38:
        sVar3 = strlen(pcVar6);
        std::__ostream_insert<char,std::char_traits<char>>(poVar2,pcVar6,sVar3);
LAB_00142c4e:
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
        std::ostream::put((char)poVar2);
        std::ostream::flush();
        core_test_fail("exr_decoding_initialize (f, 0, &cinfo, &decoder)",(char *)0x1eb,0x182953,
                       (char *)in_RCX);
LAB_00142c8d:
        sVar3 = strlen(unaff_R12);
        std::__ostream_insert<char,std::char_traits<char>>(unaff_R15,unaff_R12,sVar3);
LAB_00142ca3:
        std::ios::widen((char)*(undefined8 *)(*(long *)unaff_R15 + -0x18) + (char)unaff_R15);
        std::ostream::put((char)unaff_R15);
        std::ostream::flush();
        core_test_fail("exr_decoding_choose_default_routines (f, 0, &decoder)",(char *)0x208,
                       0x182953,(char *)in_RCX);
LAB_00142ce2:
        sVar3 = strlen(unaff_R12);
        std::__ostream_insert<char,std::char_traits<char>>(unaff_R15,unaff_R12,sVar3);
LAB_00142cf8:
        std::ios::widen((char)*(undefined8 *)(*(long *)unaff_R15 + -0x18) + (char)unaff_R15);
        std::ostream::put((char)unaff_R15);
        std::ostream::flush();
        core_test_fail("exr_decoding_run (f, 0, &decoder)",(char *)0x20a,0x182953,(char *)in_RCX);
LAB_00142d37:
        sVar3 = strlen(unaff_R12);
        std::__ostream_insert<char,std::char_traits<char>>(unaff_R15,unaff_R12,sVar3);
      }
      std::ios::widen((char)*(undefined8 *)(*(long *)unaff_R15 + -0x18) + (char)unaff_R15);
      std::ostream::put((char)unaff_R15);
      std::ostream::flush();
      core_test_fail("exr_decoding_destroy (f, &decoder)",(char *)0x21c,0x182953,(char *)in_RCX);
      goto LAB_00142d8c;
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Return Error: (",0xf);
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,iVar1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,") ",2);
    pcVar6 = (char *)exr_get_default_error_message(iVar1);
    if (pcVar6 == (char *)0x0) {
      std::ios::clear((int)poVar2 + (int)*(undefined8 *)(*(long *)poVar2 + -0x18));
    }
    else {
      sVar3 = strlen(pcVar6);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,pcVar6,sVar3);
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n    expected: (",0x10);
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,3);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,") ",2);
    pcVar6 = (char *)exr_get_default_error_message(3);
    if ((float *)pcVar6 == (float *)0x0) {
      std::ios::clear((int)poVar2 + (int)*(undefined8 *)(*(long *)poVar2 + -0x18));
      goto LAB_00143446;
    }
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Return Error: (",0xf);
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,iVar1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,") ",2);
    pcVar6 = (char *)exr_get_default_error_message(iVar1);
    if (pcVar6 == (char *)0x0) {
      std::ios::clear((int)poVar2 + (int)*(undefined8 *)(*(long *)poVar2 + -0x18));
    }
    else {
      sVar3 = strlen(pcVar6);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,pcVar6,sVar3);
    }
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
    std::ostream::put((char)poVar2);
    std::ostream::flush();
    core_test_fail("exr_start_read (&f, fn.c_str (), &cinit)",(char *)0x178,0x182953,(char *)in_RCX)
    ;
LAB_00141de7:
    sVar3 = strlen(pcVar6);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,pcVar6,sVar3);
LAB_00141dfd:
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
    std::ostream::put((char)poVar2);
    std::ostream::flush();
    core_test_fail("exr_get_storage (f, 0, &ps)",(char *)0x17b,0x182953,(char *)in_RCX);
LAB_00141e3c:
    sVar3 = strlen(pcVar6);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,pcVar6,sVar3);
LAB_00141e52:
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n    expected: (",0x10);
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,2);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,") ",2);
    pcVar6 = (char *)exr_get_default_error_message(2);
    if ((float *)pcVar6 == (float *)0x0) {
      std::ios::clear((int)poVar2 + (int)*(undefined8 *)(*(long *)poVar2 + -0x18));
    }
    else {
LAB_00142d8c:
      sVar3 = strlen(pcVar6);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,pcVar6,sVar3);
    }
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
    std::ostream::put((char)poVar2);
    std::ostream::flush();
    core_test_fail("exr_get_chunk_count (__null, 0, &ccount)",(char *)0x180,0x182953,(char *)in_RCX)
    ;
LAB_00142de1:
    sVar3 = strlen(pcVar6);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,pcVar6,sVar3);
LAB_00142df7:
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
    std::ostream::put((char)poVar2);
    std::ostream::flush();
    core_test_fail("exr_get_chunk_count (f, -1, &ccount)",(char *)0x182,0x182953,(char *)in_RCX);
LAB_00142e36:
    sVar3 = strlen(pcVar6);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,pcVar6,sVar3);
LAB_00142e4c:
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
    std::ostream::put((char)poVar2);
    std::ostream::flush();
    core_test_fail("exr_get_chunk_count (f, 11, &ccount)",(char *)0x184,0x182953,(char *)in_RCX);
LAB_00142e8b:
    sVar3 = strlen(pcVar6);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,pcVar6,sVar3);
LAB_00142ea1:
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
    std::ostream::put((char)poVar2);
    std::ostream::flush();
    core_test_fail("exr_get_chunk_count (f, 0, __null)",(char *)0x186,0x182953,(char *)in_RCX);
LAB_00142ee0:
    sVar3 = strlen(pcVar6);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,pcVar6,sVar3);
LAB_00142ef6:
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
    std::ostream::put((char)poVar2);
    std::ostream::flush();
    core_test_fail("exr_get_scanlines_per_chunk (f, 0, &ccount)",(char *)0x18a,0x182953,
                   (char *)in_RCX);
LAB_00142f35:
    sVar3 = strlen(pcVar6);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,pcVar6,sVar3);
LAB_00142f4b:
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
    std::ostream::put((char)poVar2);
    std::ostream::flush();
    core_test_fail("exr_get_tile_levels (__null, 0, &levelsx, &levelsy)",(char *)0x18f,0x182953,
                   (char *)in_RCX);
LAB_00142f8a:
    sVar3 = strlen(pcVar6);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,pcVar6,sVar3);
LAB_00142fa0:
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
    std::ostream::put((char)poVar2);
    std::ostream::flush();
    core_test_fail("exr_get_tile_levels (f, 1, &levelsx, &levelsy)",(char *)0x195,0x182953,
                   (char *)in_RCX);
LAB_00142fdf:
    sVar3 = strlen(pcVar6);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,pcVar6,sVar3);
LAB_00142ff5:
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
    std::ostream::put((char)poVar2);
    std::ostream::flush();
    core_test_fail("exr_get_tile_sizes (__null, 0, 0, 0, __null, __null)",(char *)0x1aa,0x182953,
                   (char *)in_RCX);
LAB_00143034:
    sVar3 = strlen(pcVar6);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,pcVar6,sVar3);
LAB_0014304a:
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
    std::ostream::put((char)poVar2);
    std::ostream::flush();
    core_test_fail("exr_get_tile_sizes (f, 0, -1, 0, &levelsx, &levelsy)",(char *)0x1ad,0x182953,
                   (char *)in_RCX);
LAB_00143089:
    sVar3 = strlen(pcVar6);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,pcVar6,sVar3);
LAB_0014309f:
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
    std::ostream::put((char)poVar2);
    std::ostream::flush();
    core_test_fail("exr_get_tile_sizes (f, 0, 0, -1, &levelsx, &levelsy)",(char *)0x1b0,0x182953,
                   (char *)in_RCX);
LAB_001430de:
    sVar3 = strlen(pcVar6);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,pcVar6,sVar3);
LAB_001430f4:
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
    std::ostream::put((char)poVar2);
    std::ostream::flush();
    core_test_fail("exr_get_tile_sizes (f, 0, 0, 100, &levelsx, &levelsy)",(char *)0x1b3,0x182953,
                   (char *)in_RCX);
LAB_00143133:
    sVar3 = strlen(pcVar6);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,pcVar6,sVar3);
LAB_00143149:
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
    std::ostream::put((char)poVar2);
    std::ostream::flush();
    core_test_fail("exr_get_tile_sizes (f, 0, 100, 0, &levelsx, &levelsy)",(char *)0x1b6,0x182953,
                   (char *)in_RCX);
LAB_00143188:
    sVar3 = strlen(pcVar6);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,pcVar6,sVar3);
LAB_0014319e:
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
    std::ostream::put((char)poVar2);
    std::ostream::flush();
    core_test_fail("exr_read_scanline_chunk_info (f, 0, 42, &cinfo)",(char *)0x1c4,0x182953,
                   (char *)in_RCX);
LAB_001431dd:
    sVar3 = strlen(pcVar6);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,pcVar6,sVar3);
LAB_001431f3:
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
    std::ostream::put((char)poVar2);
    std::ostream::flush();
    core_test_fail("exr_read_tile_chunk_info (__null, 0, 4, 2, 0, 0, &cinfo)",(char *)0x1c8,0x182953
                   ,(char *)in_RCX);
LAB_00143232:
    sVar3 = strlen(pcVar6);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,pcVar6,sVar3);
LAB_00143248:
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
    std::ostream::put((char)poVar2);
    std::ostream::flush();
    core_test_fail("exr_read_tile_chunk_info (f, -1, 4, 2, 0, 0, &cinfo)",(char *)0x1cb,0x182953,
                   (char *)in_RCX);
LAB_00143287:
    sVar3 = strlen(pcVar6);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,pcVar6,sVar3);
LAB_0014329d:
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
    std::ostream::put((char)poVar2);
    std::ostream::flush();
    core_test_fail("exr_read_tile_chunk_info (f, 1, 4, 2, 0, 0, &cinfo)",(char *)0x1ce,0x182953,
                   (char *)in_RCX);
LAB_001432dc:
    sVar3 = strlen(pcVar6);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,pcVar6,sVar3);
LAB_001432f2:
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
    std::ostream::put((char)poVar2);
    std::ostream::flush();
    core_test_fail("exr_read_tile_chunk_info (f, 0, 4, 2, 0, 0, __null)",(char *)0x1d1,0x182953,
                   (char *)in_RCX);
LAB_00143331:
    sVar3 = strlen(pcVar6);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,pcVar6,sVar3);
LAB_00143347:
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
    std::ostream::put((char)poVar2);
    std::ostream::flush();
    core_test_fail("exr_read_tile_chunk_info (f, 0, 4, 2, 0, -1, &cinfo)",(char *)0x1d4,0x182953,
                   (char *)in_RCX);
LAB_00143386:
    sVar3 = strlen(pcVar6);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,pcVar6,sVar3);
LAB_0014339c:
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
    std::ostream::put((char)poVar2);
    std::ostream::flush();
    core_test_fail("exr_read_tile_chunk_info (f, 0, 4, 2, -1, 0, &cinfo)",(char *)0x1d7,0x182953,
                   (char *)in_RCX);
LAB_001433db:
    sVar3 = strlen(pcVar6);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,pcVar6,sVar3);
LAB_001433f1:
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
    std::ostream::put((char)poVar2);
    std::ostream::flush();
    core_test_fail("exr_read_tile_chunk_info (f, 0, 4, -2, 0, 0, &cinfo)",(char *)0x1da,0x182953,
                   (char *)in_RCX);
  }
  sVar3 = strlen(pcVar6);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,pcVar6,sVar3);
LAB_00143446:
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
  std::ostream::put((char)poVar2);
  std::ostream::flush();
  core_test_fail("exr_read_tile_chunk_info (f, 0, -4, 2, 0, 0, &cinfo)",(char *)0x1dd,0x182953,
                 (char *)in_RCX);
  operator_delete__(poVar2);
  if (local_2d8[0] != local_2c8) {
    operator_delete(local_2d8[0],local_2c8[0] + 1);
  }
  _Unwind_Resume(extraout_RAX);
}

Assistant:

void
testOpenTiles (const std::string& tempdir)
{
    exr_context_t             f;
    std::string               fn    = ILM_IMF_TEST_IMAGEDIR;
    exr_context_initializer_t cinit = EXR_DEFAULT_CONTEXT_INITIALIZER;
    cinit.error_handler_fn          = &err_cb;

    fn += "tiled.exr";
    EXRCORE_TEST_RVAL (exr_start_read (&f, fn.c_str (), &cinit));
    exr_finish (&f);

    fn = ILM_IMF_TEST_IMAGEDIR;
    fn += "v1.7.test.tiled.exr";
    EXRCORE_TEST_RVAL (exr_start_read (&f, fn.c_str (), &cinit));
    exr_finish (&f);
}